

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O0

void ppMul2(word *c,word *a,word *b,void *stack)

{
  word *t;
  void *stack_local;
  word *b_local;
  word *a_local;
  word *c_local;
  
  *(undefined8 *)stack = 0;
  *(word *)((long)stack + 8) = *a;
  *(long *)((long)stack + 0x10) = *(long *)((long)stack + 8) << 1;
  *(ulong *)((long)stack + 0x18) = *(ulong *)((long)stack + 0x10) ^ *a;
  *(long *)((long)stack + 0x20) = *(long *)((long)stack + 0x10) << 1;
  *(ulong *)((long)stack + 0x28) = *(ulong *)((long)stack + 0x20) ^ *a;
  *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x18) << 1;
  *(ulong *)((long)stack + 0x38) = *(ulong *)((long)stack + 0x30) ^ *a;
  *(long *)((long)stack + 0x40) = *(long *)((long)stack + 0x20) << 1;
  *(ulong *)((long)stack + 0x48) = *(ulong *)((long)stack + 0x40) ^ *a;
  *(long *)((long)stack + 0x50) = *(long *)((long)stack + 0x28) << 1;
  *(ulong *)((long)stack + 0x58) = *(ulong *)((long)stack + 0x50) ^ *a;
  *(long *)((long)stack + 0x60) = *(long *)((long)stack + 0x30) << 1;
  *(ulong *)((long)stack + 0x68) = *(ulong *)((long)stack + 0x60) ^ *a;
  *(long *)((long)stack + 0x70) = *(long *)((long)stack + 0x38) << 1;
  *(ulong *)((long)stack + 0x78) = *(ulong *)((long)stack + 0x70) ^ *a;
  *c = *(long *)((long)stack + (*b >> 0x3c) * 8) << 4 ^
       *(ulong *)((long)stack + (*b >> 0x38 & 0xf) * 8);
  c[1] = *c >> 0x38;
  *c = *c << 8 ^ *(long *)((long)stack + (*b >> 0x34 & 0xf) * 8) << 4 ^
       *(ulong *)((long)stack + (*b >> 0x30 & 0xf) * 8);
  c[1] = c[1] << 8 ^ *c >> 0x38;
  *c = *c << 8 ^ *(long *)((long)stack + (*b >> 0x2c & 0xf) * 8) << 4 ^
       *(ulong *)((long)stack + (*b >> 0x28 & 0xf) * 8);
  c[1] = c[1] << 8 ^ *c >> 0x38;
  *c = *c << 8 ^ *(long *)((long)stack + (*b >> 0x24 & 0xf) * 8) << 4 ^
       *(ulong *)((long)stack + (*b >> 0x20 & 0xf) * 8);
  c[1] = c[1] << 8 ^ *c >> 0x38;
  *c = *c << 8 ^ *(long *)((long)stack + (*b >> 0x1c & 0xf) * 8) << 4 ^
       *(ulong *)((long)stack + (*b >> 0x18 & 0xf) * 8);
  c[1] = c[1] << 8 ^ *c >> 0x38;
  *c = *c << 8 ^ *(long *)((long)stack + (*b >> 0x14 & 0xf) * 8) << 4 ^
       *(ulong *)((long)stack + (*b >> 0x10 & 0xf) * 8);
  c[1] = c[1] << 8 ^ *c >> 0x38;
  *c = *c << 8 ^ *(long *)((long)stack + (*b >> 0xc & 0xf) * 8) << 4 ^
       *(ulong *)((long)stack + (*b >> 8 & 0xf) * 8);
  c[1] = c[1] << 8 ^ *c >> 0x38;
  *c = *c << 8 ^ *(long *)((long)stack + (*b >> 4 & 0xf) * 8) << 4 ^
       *(ulong *)((long)stack + (*b & 0xf) * 8);
  c[1] = (*b & 0xfefefefefefefefe) >> 1 & (long)*a >> 0x3f ^ c[1];
  c[1] = (*b & 0xfcfcfcfcfcfcfcfc) >> 2 & -(*a >> 0x3e & 1) ^ c[1];
  c[1] = (*b & 0xf8f8f8f8f8f8f8f8) >> 3 & -(*a >> 0x3d & 1) ^ c[1];
  c[1] = (*b & 0xf0f0f0f0f0f0f0f0) >> 4 & -(*a >> 0x3c & 1) ^ c[1];
  c[1] = (*b & 0xe0e0e0e0e0e0e0e0) >> 5 & -(*a >> 0x3b & 1) ^ c[1];
  c[1] = (*b & 0xc0c0c0c0c0c0c0c0) >> 6 & -(*a >> 0x3a & 1) ^ c[1];
  c[1] = (*b & 0x8080808080808080) >> 7 & -(*a >> 0x39 & 1) ^ c[1];
  *(undefined8 *)stack = 0;
  *(word *)((long)stack + 8) = a[1];
  *(long *)((long)stack + 0x10) = *(long *)((long)stack + 8) << 1;
  *(ulong *)((long)stack + 0x18) = *(ulong *)((long)stack + 0x10) ^ a[1];
  *(long *)((long)stack + 0x20) = *(long *)((long)stack + 0x10) << 1;
  *(ulong *)((long)stack + 0x28) = *(ulong *)((long)stack + 0x20) ^ a[1];
  *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x18) << 1;
  *(ulong *)((long)stack + 0x38) = *(ulong *)((long)stack + 0x30) ^ a[1];
  *(long *)((long)stack + 0x40) = *(long *)((long)stack + 0x20) << 1;
  *(ulong *)((long)stack + 0x48) = *(ulong *)((long)stack + 0x40) ^ a[1];
  *(long *)((long)stack + 0x50) = *(long *)((long)stack + 0x28) << 1;
  *(ulong *)((long)stack + 0x58) = *(ulong *)((long)stack + 0x50) ^ a[1];
  *(long *)((long)stack + 0x60) = *(long *)((long)stack + 0x30) << 1;
  *(ulong *)((long)stack + 0x68) = *(ulong *)((long)stack + 0x60) ^ a[1];
  *(long *)((long)stack + 0x70) = *(long *)((long)stack + 0x38) << 1;
  *(ulong *)((long)stack + 0x78) = *(ulong *)((long)stack + 0x70) ^ a[1];
  c[2] = *(long *)((long)stack + (b[1] >> 0x3c) * 8) << 4 ^
         *(ulong *)((long)stack + (b[1] >> 0x38 & 0xf) * 8);
  c[3] = c[2] >> 0x38;
  c[2] = c[2] << 8 ^ *(long *)((long)stack + (b[1] >> 0x34 & 0xf) * 8) << 4 ^
         *(ulong *)((long)stack + (b[1] >> 0x30 & 0xf) * 8);
  c[3] = c[3] << 8 ^ c[2] >> 0x38;
  c[2] = c[2] << 8 ^ *(long *)((long)stack + (b[1] >> 0x2c & 0xf) * 8) << 4 ^
         *(ulong *)((long)stack + (b[1] >> 0x28 & 0xf) * 8);
  c[3] = c[3] << 8 ^ c[2] >> 0x38;
  c[2] = c[2] << 8 ^ *(long *)((long)stack + (b[1] >> 0x24 & 0xf) * 8) << 4 ^
         *(ulong *)((long)stack + (b[1] >> 0x20 & 0xf) * 8);
  c[3] = c[3] << 8 ^ c[2] >> 0x38;
  c[2] = c[2] << 8 ^ *(long *)((long)stack + (b[1] >> 0x1c & 0xf) * 8) << 4 ^
         *(ulong *)((long)stack + (b[1] >> 0x18 & 0xf) * 8);
  c[3] = c[3] << 8 ^ c[2] >> 0x38;
  c[2] = c[2] << 8 ^ *(long *)((long)stack + (b[1] >> 0x14 & 0xf) * 8) << 4 ^
         *(ulong *)((long)stack + (b[1] >> 0x10 & 0xf) * 8);
  c[3] = c[3] << 8 ^ c[2] >> 0x38;
  c[2] = c[2] << 8 ^ *(long *)((long)stack + (b[1] >> 0xc & 0xf) * 8) << 4 ^
         *(ulong *)((long)stack + (b[1] >> 8 & 0xf) * 8);
  c[3] = c[3] << 8 ^ c[2] >> 0x38;
  c[2] = c[2] << 8 ^ *(long *)((long)stack + (b[1] >> 4 & 0xf) * 8) << 4 ^
         *(ulong *)((long)stack + (b[1] & 0xf) * 8);
  c[3] = (b[1] & 0xfefefefefefefefe) >> 1 & (long)a[1] >> 0x3f ^ c[3];
  c[3] = (b[1] & 0xfcfcfcfcfcfcfcfc) >> 2 & -(a[1] >> 0x3e & 1) ^ c[3];
  c[3] = (b[1] & 0xf8f8f8f8f8f8f8f8) >> 3 & -(a[1] >> 0x3d & 1) ^ c[3];
  c[3] = (b[1] & 0xf0f0f0f0f0f0f0f0) >> 4 & -(a[1] >> 0x3c & 1) ^ c[3];
  c[3] = (b[1] & 0xe0e0e0e0e0e0e0e0) >> 5 & -(a[1] >> 0x3b & 1) ^ c[3];
  c[3] = (b[1] & 0xc0c0c0c0c0c0c0c0) >> 6 & -(a[1] >> 0x3a & 1) ^ c[3];
  c[3] = (b[1] & 0x8080808080808080) >> 7 & -(a[1] >> 0x39 & 1) ^ c[3];
  *(word *)stack = c[1] ^ c[2];
  *(undefined8 *)((long)stack + 8) = 0;
  *(word *)((long)stack + 0x10) = *a ^ a[1];
  *(long *)((long)stack + 0x18) = *(long *)((long)stack + 0x10) << 1;
  *(ulong *)((long)stack + 0x20) = *(ulong *)((long)stack + 0x18) ^ *a ^ a[1];
  *(long *)((long)stack + 0x28) = *(long *)((long)stack + 0x18) << 1;
  *(ulong *)((long)stack + 0x30) = *(ulong *)((long)stack + 0x28) ^ *a ^ a[1];
  *(long *)((long)stack + 0x38) = *(long *)((long)stack + 0x20) << 1;
  *(ulong *)((long)stack + 0x40) = *(ulong *)((long)stack + 0x38) ^ *a ^ a[1];
  *(long *)((long)stack + 0x48) = *(long *)((long)stack + 0x28) << 1;
  *(ulong *)((long)stack + 0x50) = *(ulong *)((long)stack + 0x48) ^ *a ^ a[1];
  *(long *)((long)stack + 0x58) = *(long *)((long)stack + 0x30) << 1;
  *(ulong *)((long)stack + 0x60) = *(ulong *)((long)stack + 0x58) ^ *a ^ a[1];
  *(long *)((long)stack + 0x68) = *(long *)((long)stack + 0x38) << 1;
  *(ulong *)((long)stack + 0x70) = *(ulong *)((long)stack + 0x68) ^ *a ^ a[1];
  *(long *)((long)stack + 0x78) = *(long *)((long)stack + 0x40) << 1;
  *(ulong *)((long)stack + 0x80) = *(ulong *)((long)stack + 0x78) ^ *a ^ a[1];
  c[1] = *(long *)((long)stack + ((*b ^ b[1]) >> 0x3c) * 8 + 8) << 4 ^
         *(ulong *)((long)stack + ((*b ^ b[1]) >> 0x38 & 0xf) * 8 + 8);
  c[2] = c[1] >> 0x38;
  c[1] = c[1] << 8 ^ *(long *)((long)stack + ((*b ^ b[1]) >> 0x34 & 0xf) * 8 + 8) << 4 ^
         *(ulong *)((long)stack + ((*b ^ b[1]) >> 0x30 & 0xf) * 8 + 8);
  c[2] = c[2] << 8 ^ c[1] >> 0x38;
  c[1] = c[1] << 8 ^ *(long *)((long)stack + ((*b ^ b[1]) >> 0x2c & 0xf) * 8 + 8) << 4 ^
         *(ulong *)((long)stack + ((*b ^ b[1]) >> 0x28 & 0xf) * 8 + 8);
  c[2] = c[2] << 8 ^ c[1] >> 0x38;
  c[1] = c[1] << 8 ^ *(long *)((long)stack + ((*b ^ b[1]) >> 0x24 & 0xf) * 8 + 8) << 4 ^
         *(ulong *)((long)stack + ((*b ^ b[1]) >> 0x20 & 0xf) * 8 + 8);
  c[2] = c[2] << 8 ^ c[1] >> 0x38;
  c[1] = c[1] << 8 ^ *(long *)((long)stack + ((*b ^ b[1]) >> 0x1c & 0xf) * 8 + 8) << 4 ^
         *(ulong *)((long)stack + ((*b ^ b[1]) >> 0x18 & 0xf) * 8 + 8);
  c[2] = c[2] << 8 ^ c[1] >> 0x38;
  c[1] = c[1] << 8 ^ *(long *)((long)stack + ((*b ^ b[1]) >> 0x14 & 0xf) * 8 + 8) << 4 ^
         *(ulong *)((long)stack + ((*b ^ b[1]) >> 0x10 & 0xf) * 8 + 8);
  c[2] = c[2] << 8 ^ c[1] >> 0x38;
  c[1] = c[1] << 8 ^ *(long *)((long)stack + ((*b ^ b[1]) >> 0xc & 0xf) * 8 + 8) << 4 ^
         *(ulong *)((long)stack + ((*b ^ b[1]) >> 8 & 0xf) * 8 + 8);
  c[2] = c[2] << 8 ^ c[1] >> 0x38;
  c[1] = c[1] << 8 ^ *(long *)((long)stack + ((*b ^ b[1]) >> 4 & 0xf) * 8 + 8) << 4 ^
         *(ulong *)((long)stack + ((*b ^ b[1]) & 0xf) * 8 + 8);
  c[2] = ((*b ^ b[1]) & 0xfefefefefefefefe) >> 1 & (long)(*a ^ a[1]) >> 0x3f ^ c[2];
  c[2] = ((*b ^ b[1]) & 0xfcfcfcfcfcfcfcfc) >> 2 & -((*a ^ a[1]) >> 0x3e & 1) ^ c[2];
  c[2] = ((*b ^ b[1]) & 0xf8f8f8f8f8f8f8f8) >> 3 & -((*a ^ a[1]) >> 0x3d & 1) ^ c[2];
  c[2] = ((*b ^ b[1]) & 0xf0f0f0f0f0f0f0f0) >> 4 & -((*a ^ a[1]) >> 0x3c & 1) ^ c[2];
  c[2] = ((*b ^ b[1]) & 0xe0e0e0e0e0e0e0e0) >> 5 & -((*a ^ a[1]) >> 0x3b & 1) ^ c[2];
  c[2] = ((*b ^ b[1]) & 0xc0c0c0c0c0c0c0c0) >> 6 & -((*a ^ a[1]) >> 0x3a & 1) ^ c[2];
  c[2] = ((*b ^ b[1]) & 0x8080808080808080) >> 7 & -((*a ^ a[1]) >> 0x39 & 1) ^ c[2];
  c[1] = *c ^ *stack ^ c[1];
  c[2] = c[3] ^ *stack ^ c[2];
  return;
}

Assistant:

static void ppMul2(word c[4], const word a[2], const word b[2], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 2, c, 4));
	ASSERT(wwIsDisjoint2(b, 2, c, 4));
	// c1 || c0 <- a0 b0
	_MUL1(c, a[0], b[0], t);
	// c3 || c2 <- a1 b1
	_MUL1(c + 2, a[1], b[1], t);
	// t0 <- c1 + c2
	t[0] = c[1] ^ c[2];
	// с2 || с1 <- (a0 + a1)(b0 + b1)
	_MUL1(c + 1, a[0] ^ a[1], b[0] ^ b[1], t + 1);
	// c1 <- c1 + c0 + w2
	c[1] ^= c[0] ^ t[0];
	// c2 <- c2 + c3 + w2
	c[2] ^= c[3] ^ t[0];
}